

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int getnumlimit(Header *h,char **fmt,int df)

{
  char *pcVar1;
  char *pcVar2;
  
  if (0xfffffff5 < (int)**fmt - 0x3aU) {
    df = 0;
    pcVar1 = *fmt;
    do {
      pcVar2 = pcVar1 + 1;
      *fmt = pcVar2;
      df = ((int)*pcVar1 + df * 10) - 0x30;
      if (9 < (int)*pcVar2 - 0x30U) break;
      pcVar1 = pcVar2;
    } while (df < 0xccccccc);
  }
  if (df - 0x11U < 0xfffffff0) {
    luaL_error(h->L,"integral size (%d) out of limits [1,%d]",(ulong)(uint)df,0x10);
  }
  return df;
}

Assistant:

static int getnumlimit(Header *h, const char **fmt, int df) {
    int sz = getnum(fmt, df);
    if (sz > MAXINTSIZE || sz <= 0)
        luaL_error(h->L, "integral size (%d) out of limits [1,%d]",
                   sz, MAXINTSIZE);
    return sz;
}